

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_state.hpp
# Opt level: O3

void __thiscall duckdb::AggregateFinalizeData::ReturnNull(AggregateFinalizeData *this)

{
  Vector *pVVar1;
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pVVar1 = this->result;
  if (*pVVar1 == (Vector)0x2) {
    duckdb::ConstantVector::SetNull(pVVar1,true);
    return;
  }
  if (*pVVar1 == (Vector)0x0) {
    duckdb::FlatVector::SetNull(pVVar1,this->result_idx,true);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Invalid result vector type for aggregate","");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void ReturnNull() {
		switch (result.GetVectorType()) {
		case VectorType::FLAT_VECTOR:
			FlatVector::SetNull(result, result_idx, true);
			break;
		case VectorType::CONSTANT_VECTOR:
			ConstantVector::SetNull(result, true);
			break;
		default:
			throw InternalException("Invalid result vector type for aggregate");
		}
	}